

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate2.cpp
# Opt level: O0

void __thiscall
qclab::qgates::QGate2<std::complex<float>_>::apply
          (QGate2<std::complex<float>_> *this,Op op,int nbQubits,
          vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector,int offset)

{
  reference pvVar1;
  SquareMatrix<std::complex<float>_> *mat2;
  int iVar2;
  undefined4 in_register_00000084;
  SquareMatrix<std::complex<float>_> local_d8;
  undefined1 local_c8 [8];
  anon_class_136_17_7d744f41_conflict f;
  vector<int,_std::allocator<int>_> qubits;
  int offset_local;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector_local;
  int nbQubits_local;
  Op op_local;
  QGate2<std::complex<float>_> *this_local;
  
  iVar2 = offset;
  (*(this->super_QObject<std::complex<float>_>)._vptr_QObject[5])();
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&f.m44,0);
  *pvVar1 = *pvVar1 + offset;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&f.m44,1);
  *pvVar1 = *pvVar1 + offset;
  (*(this->super_QObject<std::complex<float>_>)._vptr_QObject[7])(&local_d8);
  mat2 = (SquareMatrix<std::complex<float>_> *)
         std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::data(vector);
  lambda_QGate2<std::complex<float>>
            ((anon_class_136_17_7d744f41_conflict *)local_c8,(qgates *)(ulong)(uint)(int)(char)op,
             (Op)&local_d8,mat2,(complex<float> *)CONCAT44(in_register_00000084,iVar2));
  dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_d8);
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&f.m44,0);
  iVar2 = *pvVar1;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&f.m44,1);
  apply4<qclab::qgates::lambda_QGate2<std::complex<float>>(qclab::Op,qclab::dense::SquareMatrix<std::complex<float>>,std::complex<float>*)::_lambda(unsigned_long,unsigned_long,unsigned_long,unsigned_long)_1_>
            (nbQubits,iVar2,*pvVar1,(anon_class_136_17_7d744f41_conflict *)local_c8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&f.m44);
  return;
}

Assistant:

void QGate2< T >::apply( Op op , const int nbQubits ,
                           std::vector< T >& vector , const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    auto f = lambda_QGate2( op , this->matrix() , vector.data() ) ;
    apply4( nbQubits , qubits[0] , qubits[1] , f ) ;
  }